

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.hpp
# Opt level: O0

type_conflict3
InstructionSet::x86::
resolve<unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
          (Instruction<false> *instruction,Source source,DataPointer pointer,Context *context,
          unsigned_short *none,unsigned_short *immediate)

{
  Source segment;
  ImmediateT IVar1;
  uint32_t uVar2;
  unsigned_short *puVar3;
  uint16_t local_3c;
  uint32_t target_address;
  unsigned_short *immediate_local;
  unsigned_short *none_local;
  Context *context_local;
  Source source_local;
  Instruction<false> *instruction_local;
  DataPointer pointer_local;
  
  local_3c = 0;
  switch(source) {
  case C0:
    puVar3 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                       (context);
    instruction_local._6_2_ = *puVar3;
    break;
  case C1:
    puVar3 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)1,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                       (context);
    instruction_local._6_2_ = *puVar3;
    break;
  case C2:
    puVar3 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)2,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                       (context);
    instruction_local._6_2_ = *puVar3;
    break;
  case C3:
    puVar3 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)3,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                       (context);
    instruction_local._6_2_ = *puVar3;
    break;
  case AH:
    puVar3 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)4,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                       (context);
    instruction_local._6_2_ = *puVar3;
    break;
  case C5:
    puVar3 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)5,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                       (context);
    instruction_local._6_2_ = *puVar3;
    break;
  case C6:
    puVar3 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)6,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                       (context);
    instruction_local._6_2_ = *puVar3;
    break;
  case BH:
    puVar3 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)7,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                       (context);
    instruction_local._6_2_ = *puVar3;
    break;
  case ES:
    puVar3 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)8,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                       (context);
    instruction_local._6_2_ = *puVar3;
    break;
  case CS:
    puVar3 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)9,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                       (context);
    instruction_local._6_2_ = *puVar3;
    break;
  case SS:
    puVar3 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)10,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                       (context);
    instruction_local._6_2_ = *puVar3;
    break;
  case DS:
    puVar3 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)11,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                       (context);
    instruction_local._6_2_ = *puVar3;
    break;
  case FS:
    puVar3 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)12,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                       (context);
    instruction_local._6_2_ = *puVar3;
    break;
  case GS:
    puVar3 = register_<unsigned_short,(InstructionSet::x86::AccessType)0,(InstructionSet::x86::Source)13,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                       (context);
    instruction_local._6_2_ = *puVar3;
    break;
  case None:
    instruction_local._6_2_ = *none;
    break;
  case DirectAddress:
    uVar2 = address<(InstructionSet::x86::Source)15,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                      (instruction,pointer,context);
    local_3c = (uint16_t)uVar2;
    goto switchD_007f563d_caseD_11;
  case Immediate:
    IVar1 = Instruction<false>::operand(instruction);
    *immediate = IVar1;
    instruction_local._6_2_ = *immediate;
    break;
  default:
    goto switchD_007f563d_caseD_11;
  case IndirectNoBase:
    uVar2 = address<(InstructionSet::x86::Source)23,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                      (instruction,pointer,context);
    local_3c = (uint16_t)uVar2;
    goto switchD_007f563d_caseD_11;
  case Indirect:
    uVar2 = address<(InstructionSet::x86::Source)24,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                      (instruction,pointer,context);
    local_3c = (uint16_t)uVar2;
switchD_007f563d_caseD_11:
    segment = Instruction<false>::data_segment(instruction);
    instruction_local._6_2_ =
         PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)0>
                   (&context->memory,segment,local_3c);
  }
  return instruction_local._6_2_;
}

Assistant:

typename Accessor<IntT, access>::type resolve(
	InstructionT &instruction,
	Source source,
	DataPointer pointer,
	ContextT &context,
	IntT *none,
	IntT *immediate
) {
	// Rules:
	//
	// * if this is a memory access, set target_address and break;
	// * otherwise return the appropriate value.
	uint32_t target_address = 0;
	switch(source) {
		// Defer all register accesses to the register-specific lookup.
		case Source::eAX:		return *register_<IntT, access, Source::eAX>(context);
		case Source::eCX:		return *register_<IntT, access, Source::eCX>(context);
		case Source::eDX:		return *register_<IntT, access, Source::eDX>(context);
		case Source::eBX:		return *register_<IntT, access, Source::eBX>(context);
		case Source::eSPorAH:	return *register_<IntT, access, Source::eSPorAH>(context);
		case Source::eBPorCH:	return *register_<IntT, access, Source::eBPorCH>(context);
		case Source::eSIorDH:	return *register_<IntT, access, Source::eSIorDH>(context);
		case Source::eDIorBH:	return *register_<IntT, access, Source::eDIorBH>(context);
		case Source::ES:		return *register_<IntT, access, Source::ES>(context);
		case Source::CS:		return *register_<IntT, access, Source::CS>(context);
		case Source::SS:		return *register_<IntT, access, Source::SS>(context);
		case Source::DS:		return *register_<IntT, access, Source::DS>(context);
		case Source::FS:		return *register_<IntT, access, Source::FS>(context);
		case Source::GS:		return *register_<IntT, access, Source::GS>(context);

		case Source::None:		return *none;

		case Source::Immediate:
			*immediate = IntT(instruction.operand());
		return *immediate;

		case Source::Indirect:
			target_address = address<Source::Indirect, IntT, access>(instruction, pointer, context);
		break;
		case Source::IndirectNoBase:
			target_address = address<Source::IndirectNoBase, IntT, access>(instruction, pointer, context);
		break;
		case Source::DirectAddress:
			target_address = address<Source::DirectAddress, IntT, access>(instruction, pointer, context);
		break;
	}

	// If execution has reached here then a memory fetch is required.
	// Do it and exit.
	//
	// TODO: support 32-bit addresses.
	return context.memory.template access<IntT, access>(instruction.data_segment(), uint16_t(target_address));
}